

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

ScriptFunctionType * __thiscall Js::FunctionProxy::AllocDeferredPrototypeType(FunctionProxy *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ScriptFunctionType *pSVar4;
  
  if ((this->deferredPrototypeType).ptr != (ScriptFunctionType *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x83a,"(deferredPrototypeType == nullptr)",
                                "deferredPrototypeType == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pSVar4 = ScriptFunctionType::New(this,true);
  Memory::Recycler::WBSetBit((char *)&this->deferredPrototypeType);
  (this->deferredPrototypeType).ptr = pSVar4;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->deferredPrototypeType);
  return pSVar4;
}

Assistant:

ScriptFunctionType * FunctionProxy::AllocDeferredPrototypeType()
    {
        Assert(deferredPrototypeType == nullptr);
        ScriptFunctionType * type = ScriptFunctionType::New(this, true);
        deferredPrototypeType = type;
        return type;
    }